

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qintc.cc
# Opt level: O2

void try_range_check_subtract_real<int>(char *description,bool exp_pass,int *a,int *b)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  
  QIntC::range_check_subtract<int>((int *)CONCAT71(in_register_00000031,exp_pass),a);
  poVar1 = std::operator<<((ostream *)&std::cout,description);
  std::operator<<(poVar1,": okay");
  poVar1 = std::operator<<((ostream *)&std::cout," PASSED");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

static void
try_range_check_subtract_real(char const* description, bool exp_pass, T const& a, T const& b)
{
    bool passed = false;
    try {
        QIntC::range_check_subtract(a, b);
        std::cout << description << ": okay";
        passed = true;
    } catch (std::range_error& e) {
        std::cout << description << ": " << e.what();
        passed = false;
    }
    std::cout << ((passed == exp_pass) ? " PASSED" : " FAILED") << std::endl;
}